

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_augment(lysp_yin_ctx *ctx,tree_node_meta *aug_meta)

{
  lysp_node *plVar1;
  size_t sVar2;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar3;
  ly_ctx *local_a8;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  size_t subelems_size;
  yin_subelement *subelems;
  lysp_node **pplStack_58;
  LY_ERR ret;
  lysp_node_augment **augs;
  lysp_node_augment *aug;
  tree_node_meta *aug_meta_local;
  lysp_yin_ctx *ctx_local;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  pplStack_58 = aug_meta->nodes;
  subelems._4_4_ = 0;
  subelems_size = 0;
  aug = (lysp_node_augment *)aug_meta;
  aug_meta_local = (tree_node_meta *)ctx;
  augs = (lysp_node_augment **)calloc(1,0x60);
  if ((lysp_node *)augs == (lysp_node *)0x0) {
    ly_log((ly_ctx *)*aug_meta_local[4].nodes,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yin_parse_augment");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    if (*pplStack_58 == (lysp_node *)0x0) {
      *pplStack_58 = (lysp_node *)augs;
    }
    else {
      plVar1 = *pplStack_58;
      while (_ret___1 = (long *)((long)plVar1 + (long)*pplStack_58 + (0x10 - (long)*pplStack_58)),
            *_ret___1 != 0) {
        plVar1 = (lysp_node *)*_ret___1;
      }
      *_ret___1 = (long)augs;
    }
    ((lysp_node *)augs)->nodetype = 0x8000;
    ((lysp_node *)augs)->parent = (aug->field_0).node.parent;
    ctx_local._4_4_ = lyxml_ctx_next((lyxml_ctx *)aug_meta_local[4].nodes);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ =
             yin_parse_attribute((lysp_yin_ctx *)aug_meta_local,YIN_ARG_TARGET_NODE,
                                 (char **)(augs + 3),Y_STR_ARG,LY_STMT_AUGMENT),
       ctx_local._4_4_ == LY_SUCCESS)) {
      sVar2 = strlen((char *)augs[3]);
      if (sVar2 == 0) {
        if (aug_meta_local == (tree_node_meta *)0x0) {
          local_a8 = (ly_ctx *)0x0;
        }
        else {
          local_a8 = (ly_ctx *)
                     (&aug_meta_local[3].nodes[1]->parent)
                     [*(int *)((long)aug_meta_local[3].nodes + 4) - 1]->parent->parent;
        }
        ly_log(local_a8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
               "augment");
      }
      ctx_local._4_4_ =
           subelems_allocator((lysp_yin_ctx *)aug_meta_local,0x11,(lysp_node *)augs,
                              (yin_subelement **)&subelems_size,8,augs + 10,CONCAT44(uVar3,8),0x20,
                              augs + 8,8,0x40,augs + 8,0,0x100,augs + 8,0,0x200,augs + 8,0,0x400,
                              augs + 8,0,0x80000,augs + 4,2,0x130000,augs + 6,0,0x1000,augs + 8,0,
                              0x2000,augs + 8,0,0x4000,augs + 8,0,1,augs + 0xb,8,0x270000,augs + 5,2
                              ,0x2c0000,(long)augs + 10,2,0x8000,augs + 8,0,0x330000,augs + 9,2,
                              0xf0000,0,0);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        subelems._4_4_ =
             yin_parse_content((lysp_yin_ctx *)aug_meta_local,(yin_subelement *)subelems_size,0x11,
                               augs,LY_STMT_AUGMENT,(char **)0x0,(lysp_ext_instance **)(augs + 7));
        subelems_deallocator(0x11,(yin_subelement *)subelems_size);
        if (subelems._4_4_ == LY_SUCCESS) {
          ctx_local._4_4_ =
               yin_unres_exts_add((lysp_yin_ctx *)aug_meta_local,(lysp_ext_instance *)augs[7]);
          if (ctx_local._4_4_ == LY_SUCCESS) {
            ctx_local._4_4_ = LY_SUCCESS;
          }
        }
        else {
          ctx_local._4_4_ = subelems._4_4_;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_augment(struct lysp_yin_ctx *ctx, struct tree_node_meta *aug_meta)
{
    struct lysp_node_augment *aug;
    struct lysp_node_augment **augs = (struct lysp_node_augment **)aug_meta->nodes;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;

    /* create new augment */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, augs, aug, next, LY_EMEM);
    aug->nodetype = LYS_AUGMENT;
    aug->parent = aug_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &aug->nodeid, Y_STR_ARG, LY_STMT_AUGMENT));
    CHECK_NONEMPTY((struct lysp_ctx *)ctx, strlen(aug->nodeid), "augment");

    /* parser augment content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 17, (struct lysp_node *)aug, &subelems,
            LY_STMT_ACTION, &aug->actions, YIN_SUBELEM_VER2,
            LY_STMT_ANYDATA, &aug->child, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &aug->child, 0,
            LY_STMT_CASE, &aug->child, 0,
            LY_STMT_CHOICE, &aug->child, 0,
            LY_STMT_CONTAINER, &aug->child, 0,
            LY_STMT_DESCRIPTION, &aug->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_IF_FEATURE, &aug->iffeatures, 0,
            LY_STMT_LEAF, &aug->child, 0,
            LY_STMT_LEAF_LIST, &aug->child, 0,
            LY_STMT_LIST, &aug->child, 0,
            LY_STMT_NOTIFICATION, &aug->notifs, YIN_SUBELEM_VER2,
            LY_STMT_REFERENCE, &aug->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &aug->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_USES, &aug->child, 0,
            LY_STMT_WHEN, &aug->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, aug, LY_STMT_AUGMENT, NULL, &aug->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, aug->exts));

    return LY_SUCCESS;
}